

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4077::InputSourcePreprocessing::Get
          (InputSourcePreprocessing *this,vector<double,_std::allocator<double>_> *buffer)

{
  uint uVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  bool bVar8;
  
  if (this->is_valid_ != true) {
    return false;
  }
  iVar4 = (*this->source_->_vptr_InputSourceInterface[4])();
  if ((char)iVar4 == '\0') {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (this->input_format_ == kMeanTimesPrecisionAndPrecision) {
      uVar1 = this->half_read_size_;
      pdVar6 = (buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 0;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        pdVar6[(long)(int)uVar1 + uVar7] = 1.0 / pdVar6[(long)(int)uVar1 + uVar7];
      }
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        *pdVar6 = pdVar6[(int)uVar1] * *pdVar6;
        pdVar6 = pdVar6 + 1;
      }
    }
    else if (this->input_format_ == kMeanAndPrecision) {
      uVar1 = this->half_read_size_;
      pdVar2 = (buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        pdVar2[(long)(int)uVar1 + uVar5] = 1.0 / pdVar2[(long)(int)uVar1 + uVar5];
      }
    }
  }
  return bVar3;
}

Assistant:

bool Get(std::vector<double>* buffer) override {
    if (!is_valid_) {
      return false;
    }
    if (!source_->Get(buffer)) {
      return false;
    }
    switch (input_format_) {
      case kMeanAndVariance: {
        // Nothing to do.
        break;
      }
      case kMeanAndPrecision: {
        double* variance(&((*buffer)[half_read_size_]));
        for (int i(0); i < half_read_size_; ++i) {
          variance[i] = 1.0 / variance[i];
        }
        break;
      }
      case kMeanTimesPrecisionAndPrecision: {
        double* variance(&((*buffer)[half_read_size_]));
        for (int i(0); i < half_read_size_; ++i) {
          variance[i] = 1.0 / variance[i];
        }
        double* mean(&((*buffer)[0]));
        for (int i(0); i < half_read_size_; ++i) {
          mean[i] *= variance[i];
        }
        break;
      }
      default: {
        break;
      }
    }
    return true;
  }